

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lysp_stmt_any(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  uint16_t *flags;
  ly_stmt stmt_00;
  uint uVar1;
  lysp_node *plVar2;
  lysp_stmt *stmt_01;
  LY_ERR LVar3;
  LY_ERR LVar4;
  lysp_node *plVar5;
  lysp_node *plVar6;
  char *pcVar7;
  char *pcVar8;
  uint32_t substmt_index;
  ly_ctx *plVar9;
  lysp_ext_instance **in_R8;
  lysp_ext_instance **in_R9;
  lysp_stmt **pplVar10;
  
  LVar3 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (LVar3 == LY_SUCCESS) {
    plVar5 = (lysp_node *)calloc(1,0x50);
    if (plVar5 == (lysp_node *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar9 = (ly_ctx *)0x0;
      }
      else {
        plVar9 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = LY_EMEM;
      ly_log(plVar9,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_any");
    }
    else {
      plVar2 = *siblings;
      if (*siblings != (lysp_node *)0x0) {
        do {
          plVar6 = plVar2;
          plVar2 = plVar6->next;
        } while (plVar2 != (lysp_node *)0x0);
        siblings = &plVar6->next;
      }
      *siblings = plVar5;
      plVar5->nodetype = (ushort)(stmt->kw == LY_STMT_ANYDATA) << 6 | 0x20;
      plVar5->parent = parent;
      if (ctx == (lysp_ctx *)0x0) {
        plVar9 = (ly_ctx *)0x0;
      }
      else {
        plVar9 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = lydict_insert(plVar9,stmt->arg,0,&plVar5->name);
      if (LVar3 == LY_SUCCESS) {
        exts = &plVar5->exts;
        flags = &plVar5->flags;
        LVar3 = LY_SUCCESS;
        pplVar10 = &stmt->child;
        while (stmt_01 = *pplVar10, stmt_01 != (lysp_stmt *)0x0) {
          stmt_00 = stmt_01->kw;
          if (stmt_00 == LY_STMT_WHEN) {
            LVar4 = lysp_stmt_when(ctx,stmt_01,(lysp_when **)&plVar5[1].nodetype);
          }
          else {
            substmt_index = (int)plVar5 + 0x20;
            if (stmt_00 == LY_STMT_DESCRIPTION) {
LAB_001648b7:
              in_R8 = exts;
              LVar4 = lysp_stmt_text_field
                                (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
            }
            else if (stmt_00 == LY_STMT_EXTENSION_INSTANCE) {
              in_R8 = exts;
              LVar4 = lysp_stmt_ext(ctx,stmt_01,stmt->kw,0,exts);
            }
            else if (stmt_00 == LY_STMT_IF_FEATURE) {
              LVar4 = lysp_stmt_qnames(ctx,stmt_01,&plVar5->iffeatures,(yang_arg)exts,in_R8);
            }
            else if (stmt_00 == LY_STMT_MANDATORY) {
              LVar4 = lysp_stmt_mandatory(ctx,stmt_01,flags,exts);
            }
            else if (stmt_00 == LY_STMT_MUST) {
              LVar4 = lysp_stmt_restrs(ctx,stmt_01,(lysp_restr **)(plVar5 + 1));
            }
            else {
              substmt_index = (int)plVar5 + 0x28;
              if (stmt_00 == LY_STMT_REFERENCE) goto LAB_001648b7;
              if (stmt_00 == LY_STMT_STATUS) {
                LVar4 = lysp_stmt_status(ctx,stmt_01,flags,exts);
              }
              else {
                if (stmt_00 != LY_STMT_CONFIG) {
                  if (ctx == (lysp_ctx *)0x0) {
                    plVar9 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar9 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  }
                  pcVar7 = lyplg_ext_stmt2str(stmt_00);
                  uVar1._0_2_ = plVar5->nodetype;
                  uVar1._2_2_ = plVar5->flags;
                  pcVar8 = lyplg_ext_stmt2str((uint)((~uVar1 & 0x60) != 0) * 0x20 + LY_STMT_ANYDATA)
                  ;
                  ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,
                          "Invalid keyword \"%s\" as a child of \"%s\".",pcVar7,pcVar8);
                  return LY_EVALID;
                }
                LVar4 = lysp_stmt_config(ctx,stmt_01,flags,exts);
              }
            }
          }
          if (LVar4 != LY_SUCCESS) {
            return LVar4;
          }
          pplVar10 = &stmt_01->next;
        }
      }
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_any(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent, struct lysp_node **siblings)
{
    struct lysp_node_anydata *any;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    /* create new structure and insert into siblings */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, any, next, LY_EMEM);

    any->nodetype = stmt->kw == LY_STMT_ANYDATA ? LYS_ANYDATA : LYS_ANYXML;
    any->parent = parent;

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &any->name));

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(lysp_stmt_config(ctx, child, &any->flags, &any->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &any->dsc, Y_STR_ARG, &any->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &any->iffeatures, Y_STR_ARG, &any->exts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(lysp_stmt_mandatory(ctx, child, &any->flags, &any->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(lysp_stmt_restrs(ctx, child, &any->musts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &any->ref, Y_STR_ARG, &any->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &any->flags, &any->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(lysp_stmt_when(ctx, child, &any->when));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, 0, &any->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw),
                    (any->nodetype & LYS_ANYDATA) == LYS_ANYDATA ? lyplg_ext_stmt2str(LY_STMT_ANYDATA) : lyplg_ext_stmt2str(LY_STMT_ANYXML));
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}